

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

Vector * KDIS::DATA_TYPE::Vector::Lerp
                   (Vector *__return_storage_ptr__,Vector *From,Vector *To,KFLOAT32 T)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Vector tmp;
  DataTypeBase local_48;
  undefined8 local_40;
  float local_38;
  Vector local_30;
  
  local_48._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00216e98;
  uVar3 = To->m_f32X;
  uVar4 = To->m_f32Y;
  uVar1 = From->m_f32X;
  uVar2 = From->m_f32Y;
  local_40 = CONCAT44((float)uVar4 - (float)uVar2,(float)uVar3 - (float)uVar1);
  local_38 = (float)To->m_f32Z - (float)From->m_f32Z;
  local_30.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00216e98;
  local_30.m_f32X = (float)T * ((float)uVar3 - (float)uVar1);
  local_30.m_f32Y = (float)T * ((float)uVar4 - (float)uVar2);
  local_30.m_f32Z = (KFLOAT32)((float)T * local_38);
  operator+(From,&local_30);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_48);
  return __return_storage_ptr__;
}

Assistant:

KFLOAT32 Vector::GetX() const
{
    return m_f32X;
}